

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

void __thiscall
helics::HandleManager::addHandleAtIndex
          (HandleManager *this,BasicHandleInfo *otherHandle,int32_t index)

{
  iterator *this_00;
  _Map_pointer ppBVar1;
  int iVar2;
  int iVar3;
  reference pBVar4;
  int iVar5;
  
  ppBVar1 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar5 = ((int)((ulong)((long)ppBVar1 -
                        (long)(this->handles).
                              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppBVar1 == (_Map_pointer)0x0)) * 3;
  iVar3 = (int)((long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * 0x286bca1b;
  iVar2 = (int)((long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x286bca1b;
  if (iVar2 + iVar3 + iVar5 == index) {
    addHandle(this,otherHandle);
    return;
  }
  if (-1 < index) {
    this_00 = &(this->handles).
               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
               _M_impl.super__Deque_impl_data._M_start;
    if (iVar2 + iVar5 + iVar3 <= index) {
      if (index == 0) {
        return;
      }
      std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::resize
                (&this->handles,(ulong)(uint)index + 1);
    }
    pBVar4 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](this_00,(ulong)(uint)index);
    BasicHandleInfo::BasicHandleInfo(pBVar4,otherHandle);
    pBVar4 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](this_00,(ulong)(uint)index);
    addSearchFields(this,pBVar4,index);
    return;
  }
  return;
}

Assistant:

void HandleManager::addHandleAtIndex(const BasicHandleInfo& otherHandle, int32_t index)
{
    if (index == static_cast<int32_t>(handles.size())) {
        addHandle(otherHandle);
    } else if (isValidIndex(index, handles)) {
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    } else if (index > 0) {
        handles.resize(static_cast<size_t>(index) + 1);
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    }
}